

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

void pstore::command_line::details::report_unknown_option<std::__cxx11::ostringstream>
               (string *program_name,string *arg_name,string *value,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  ostream *poVar1;
  options_container *all_options;
  option **ppoVar2;
  string *psVar3;
  size_t sVar4;
  char *pcVar5;
  allocator local_71;
  string nearest_string;
  string local_50 [32];
  maybe<pstore::command_line::option_*,_void> best_option;
  
  poVar1 = std::operator<<((ostream *)errs,(string *)program_name);
  poVar1 = std::operator<<(poVar1,": Unknown command line argument \'");
  poVar1 = std::operator<<(poVar1,(string *)arg_name);
  std::operator<<(poVar1,"\'\n");
  all_options = option::all_abi_cxx11_();
  lookup_nearest_option(&best_option,arg_name,all_options);
  if (best_option.valid_ == true) {
    ppoVar2 = maybe<pstore::command_line::option_*,_void>::operator->(&best_option);
    psVar3 = option::name_abi_cxx11_(*ppoVar2);
    std::__cxx11::string::string((string *)&nearest_string,(string *)psVar3);
    sVar4 = utf::length(&nearest_string);
    pcVar5 = "--";
    if (sVar4 < 2) {
      pcVar5 = "-";
    }
    if (value->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)&nearest_string);
      std::__cxx11::string::append((string *)&nearest_string);
    }
    poVar1 = std::operator<<((ostream *)errs,"Did you mean \'");
    std::__cxx11::string::string(local_50,pcVar5,&local_71);
    poVar1 = std::operator<<(poVar1,local_50);
    poVar1 = std::operator<<(poVar1,(string *)&nearest_string);
    std::operator<<(poVar1,"\'?\n");
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&nearest_string);
  }
  return;
}

Assistant:

void report_unknown_option (std::string const & program_name,
                                        std::string const & arg_name, std::string const & value,
                                        ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                errs << str::out_string (program_name)
                     << str::out_text (": Unknown command line argument '")
                     << str::out_string (arg_name) << str::out_text ("'\n");

                if (maybe<option *> const best_option =
                        lookup_nearest_option (arg_name, option::all ())) {
                    std::string nearest_string = (*best_option)->name ();
                    gsl::czstring const dashes = utf::length (nearest_string) < 2U ? "-" : "--";
                    if (!value.empty ()) {
                        nearest_string += '=';
                        nearest_string += value;
                    }
                    errs << str::out_text ("Did you mean '") << str::out_string (dashes)
                         << str::out_string (nearest_string) << str::out_text ("'?\n");
                }
            }